

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

string * __thiscall
cfd::js::api::json::AdaptEcdsaAdaptorRequest::GetAdaptorSignatureString_abi_cxx11_
          (string *__return_storage_ptr__,AdaptEcdsaAdaptorRequest *this,
          AdaptEcdsaAdaptorRequest *obj)

{
  core::ConvertToString<std::__cxx11::string>
            (__return_storage_ptr__,(core *)&this->adaptor_signature_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetAdaptorSignatureString(  // line separate
      const AdaptEcdsaAdaptorRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.adaptor_signature_);
  }